

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

int16_t spell_chance(wchar_t spell_index)

{
  short sVar1;
  int iVar2;
  int iVar3;
  loc_conflict grid;
  _Bool _Var4;
  wchar_t wVar5;
  class_spell_conflict *spell_00;
  class_spell_conflict *spell;
  wchar_t minfail;
  wchar_t chance;
  wchar_t spell_index_local;
  
  if ((player->class->magic).total_spells == 0) {
    chance._2_2_ = 100;
  }
  else {
    spell_00 = spell_by_index(player,spell_index);
    if (spell_00 == (class_spell_conflict *)0x0) {
      chance._2_2_ = 100;
    }
    else {
      iVar2 = spell_00->sfail;
      sVar1 = player->lev;
      iVar3 = spell_00->slevel;
      wVar5 = fail_adjust(player,spell_00);
      spell._4_4_ = (iVar2 + (sVar1 - iVar3) * -3) - wVar5;
      if ((int)player->csp < spell_00->smana) {
        spell._4_4_ = (spell_00->smana - (int)player->csp) * 5 + spell._4_4_;
      }
      spell._0_4_ = min_fail(player,spell_00);
      _Var4 = flag_has_dbg((player->state).pflags,10,0x2d,"player->state.pflags","(PF_STRONG_MAGIC)"
                          );
      if ((!_Var4) && ((wchar_t)spell < L'\x05')) {
        spell._0_4_ = L'\x05';
      }
      _Var4 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
      if ((_Var4) &&
         (grid.x = (player->grid).x, grid.y = (player->grid).y,
         _Var4 = square_islit((chunk *)cave,grid), _Var4)) {
        spell._4_4_ = spell._4_4_ + L'\x19';
      }
      _Var4 = player_of_has(player,L'\x1c');
      if (_Var4) {
        spell._4_4_ = spell._4_4_ + L'\x14';
      }
      if (spell._4_4_ < (wchar_t)spell) {
        spell._4_4_ = (wchar_t)spell;
      }
      if (L'2' < spell._4_4_) {
        spell._4_4_ = L'2';
      }
      if (player->timed[9] < 0x33) {
        if (player->timed[9] != 0) {
          spell._4_4_ = spell._4_4_ + L'\x0f';
        }
      }
      else {
        spell._4_4_ = spell._4_4_ + L'\x19';
      }
      if (player->timed[0x19] != 0) {
        spell._4_4_ = spell._4_4_ / 2 + L'2';
      }
      if (L'_' < spell._4_4_) {
        spell._4_4_ = L'_';
      }
      chance._2_2_ = (int16_t)spell._4_4_;
    }
  }
  return chance._2_2_;
}

Assistant:

int16_t spell_chance(int spell_index)
{
	int chance = 100, minfail;

	const struct class_spell *spell;

	/* Paranoia -- must be literate */
	if (!player->class->magic.total_spells) return chance;

	/* Get the spell */
	spell = spell_by_index(player, spell_index);
	if (!spell) return chance;

	/* Extract the base spell failure rate */
	chance = spell->sfail;

	/* Reduce failure rate by "effective" level adjustment */
	chance -= 3 * (player->lev - spell->slevel);

	/* Reduce failure rate by casting stat level adjustment */
	chance -= fail_adjust(player, spell);

	/* Not enough mana to cast */
	if (spell->smana > player->csp)
		chance += 5 * (spell->smana - player->csp);

	/* Get the minimum failure rate for the casting stat level */
	minfail = min_fail(player, spell);

	/* Non-full spellcasters never get better than 5 percent */
	if (!player_has(player, PF_STRONG_MAGIC) && minfail < 5) {
		minfail = 5;
	}

	/* Necromancers are punished by being on lit squares */
	if (player_has(player, PF_UNLIGHT) && square_islit(cave, player->grid)) {
		chance += 25;
	}

	/* Fear makes spells harder (before minfail) */
	/* Note that spells that remove fear have a much lower fail rate than
	 * surrounding spells, to make sure this doesn't cause mega fail */
	if (player_of_has(player, OF_AFRAID)) chance += 20;

	/* Minimal and maximal failure rate */
	if (chance < minfail) chance = minfail;
	if (chance > 50) chance = 50;

	/* Stunning makes spells harder (after minfail) */
	if (player->timed[TMD_STUN] > 50) {
		chance += 25;
	} else if (player->timed[TMD_STUN]) {
		chance += 15;
	}

	/* Amnesia makes spells very difficult */
	if (player->timed[TMD_AMNESIA]) {
		chance = 50 + chance / 2;
	}

	/* Always a 5 percent chance of working */
	if (chance > 95) {
		chance = 95;
	}

	/* Return the chance */
	return (chance);
}